

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  uint uVar1;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0x20) != 0) {
    Vec_PtrPush(vLeaves,pObj);
    uVar1 = *(uint *)&pObj->field_0x14 & 0xffffffdf;
    *(uint *)&pObj->field_0x14 = uVar1;
  }
  if ((uVar1 & 0x40) == 0) {
    *(uint *)&pObj->field_0x14 = uVar1 | 0x40;
    if ((pObj->vFanins).nSize == 2) {
      Abc_NodeSuperChoiceCollect_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves,vVolume);
      Abc_NodeSuperChoiceCollect_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vLeaves,vVolume);
      Vec_PtrPush(vVolume,pObj);
      return;
    }
    __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLut.c"
                  ,0x1c0,
                  "void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkB )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkB = 0;
    }
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin0(pObj), vLeaves, vVolume );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin1(pObj), vLeaves, vVolume );
    Vec_PtrPush( vVolume, pObj );
}